

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void __thiscall gguf_kv::cast(gguf_kv *this,gguf_type new_type)

{
  size_t sVar1;
  size_type sVar2;
  gguf_type in_ESI;
  long in_RDI;
  size_t new_type_size;
  
  sVar1 = gguf_type_size(in_ESI);
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x28));
  if (sVar2 % sVar1 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",
               0xc4,"GGML_ASSERT(%s) failed","data.size() % new_type_size == 0");
  }
  *(gguf_type *)(in_RDI + 0x24) = in_ESI;
  return;
}

Assistant:

void cast(const enum gguf_type new_type) {
        const size_t new_type_size = gguf_type_size(new_type);
        GGML_ASSERT(data.size() % new_type_size == 0);
        type = new_type;
    }